

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_matrix.h
# Opt level: O2

_matrix<double> * __thiscall
xray_re::_matrix<double>::mk_xform(_matrix<double> *this,_quaternion<double> *q,_vector3<double> *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = (q->field_0).field_0.w;
  dVar2 = (q->field_0).field_0.x;
  dVar3 = (q->field_0).field_0.y;
  dVar4 = (q->field_0).field_0.z;
  dVar6 = dVar4 * dVar4;
  dVar5 = dVar2 * dVar2 + dVar3 * dVar3;
  dVar7 = 2.0 / (dVar1 * dVar1 + dVar5 + dVar6);
  (this->field_0).field_0._11 = 1.0 - (dVar3 * dVar3 + dVar6) * dVar7;
  (this->field_0).field_0._12 = (dVar2 * dVar3 - dVar1 * dVar4) * dVar7;
  (this->field_0).field_0._13 = (dVar1 * dVar3 + dVar2 * dVar4) * dVar7;
  (this->field_0).field_0._14 = 0.0;
  (this->field_0).field_0._21 = (dVar2 * dVar3 + dVar1 * dVar4) * dVar7;
  (this->field_0).field_0._22 = 1.0 - (dVar6 + dVar2 * dVar2) * dVar7;
  (this->field_0).field_0._23 = (dVar3 * dVar4 - dVar1 * dVar2) * dVar7;
  (this->field_0).field_0._24 = 0.0;
  (this->field_0).field_0._31 = (dVar2 * dVar4 - dVar1 * dVar3) * dVar7;
  (this->field_0).field_0._32 = (dVar3 * dVar4 + dVar1 * dVar2) * dVar7;
  (this->field_0).field_0._33 = 1.0 - dVar7 * dVar5;
  (this->field_0).field_0._34 = 0.0;
  (this->field_0).field_0._41 = (v->field_0).field_0.x;
  (this->field_0).field_0._42 = (v->field_0).field_0.y;
  (this->field_0).field_0._43 = (v->field_0).field_0.z;
  (this->field_0).field_0._44 = 1.0;
  return this;
}

Assistant:

_matrix<T>& _matrix<T>::mk_xform(const _quaternion<T>& q, const _vector3<T>& v)
{
	T wx = q.w*q.x;
	T wy = q.w*q.y;
	T wz = q.w*q.z;

	T xx = q.x*q.x;
	T xy = q.x*q.y;
	T xz = q.x*q.z;

	T yy = q.y*q.y;
	T yz = q.y*q.z;
	T zz = q.z*q.z;

#if 1
	// can't assume the unit quaternion because of quantization errors.
	T s = T(2)/(xx + yy + zz + q.w*q.w);
#else
	xr_assert(equivalent<T>(q.magnitude(), 1, T(1e-3)));
	const T s = 2;
#endif

	i.set(T(1) - s*(yy + zz), s*(xy - wz), s*(xz + wy)); _14 = 0;
	j.set(s*(xy + wz), T(1) - s*(xx + zz), s*(yz - wx)); _24 = 0;
	k.set(s*(xz - wy), s*(yz + wx), T(1) - s*(xx + yy)); _34 = 0;
	c.set(v); _44 = T(1);

	return *this;
}